

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

size_t SaveEXRMultipartImageToMemory
                 (EXRImage *exr_images,EXRHeader **exr_headers,uint num_parts,uchar **memory_out,
                 char **err)

{
  long in_RCX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  char **in_stack_00000530;
  uchar **in_stack_00000538;
  uint in_stack_00000544;
  EXRHeader **in_stack_00000548;
  EXRImage *in_stack_00000550;
  char **in_stack_ffffffffffffff88;
  string *msg;
  undefined1 local_51 [73];
  size_t local_8;
  
  if ((((in_RDI == 0) || (in_RSI == 0)) || (in_EDX < 2)) || (in_RCX == 0)) {
    msg = (string *)local_51;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_51 + 1),"Invalid argument for SaveEXRNPartImageToMemory",
               (allocator *)msg);
    tinyexr::SetErrorMessage(msg,in_stack_ffffffffffffff88);
    std::__cxx11::string::~string((string *)(local_51 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_51);
    local_8 = 0;
  }
  else {
    local_8 = tinyexr::SaveEXRNPartImageToMemory
                        (in_stack_00000550,in_stack_00000548,in_stack_00000544,in_stack_00000538,
                         in_stack_00000530);
  }
  return local_8;
}

Assistant:

size_t SaveEXRMultipartImageToMemory(const EXRImage* exr_images,
                                     const EXRHeader** exr_headers,
                                     unsigned int num_parts,
                                     unsigned char** memory_out, const char** err) {
  if (exr_images == NULL || exr_headers == NULL || num_parts < 2 ||
      memory_out == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for SaveEXRNPartImageToMemory",
                              err);
    return 0;
  }
  return tinyexr::SaveEXRNPartImageToMemory(exr_images, exr_headers, num_parts, memory_out, err);
}